

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O0

Vec_Int_t * Pdr_ManCubeToLits(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,int fCompl,int fNext)

{
  Aig_Man_t *pAVar1;
  Vec_Int_t *p_00;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Aig_Obj_t *pObj_00;
  abctime aVar5;
  int local_6c;
  abctime clk;
  int iVarMax;
  int iVar;
  int i;
  Aig_Obj_t *pObj;
  int fNext_local;
  int fCompl_local;
  Pdr_Set_t *pCube_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  clk._4_4_ = 0;
  aVar4 = Abc_Clock();
  Vec_IntClear(p->vLits);
  iVarMax = 0;
  do {
    if (pCube->nLits <= iVarMax) {
      aVar5 = Abc_Clock();
      p->tCnf = (aVar5 - aVar4) + p->tCnf;
      return p->vLits;
    }
    if (*(int *)(&pCube->field_0x14 + (long)iVarMax * 4) != -1) {
      if (fNext == 0) {
        pAVar1 = p->pAig;
        iVar2 = Abc_Lit2Var(*(int *)(&pCube->field_0x14 + (long)iVarMax * 4));
        pObj_00 = Saig_ManLo(pAVar1,iVar2);
        local_6c = 3;
      }
      else {
        pAVar1 = p->pAig;
        iVar2 = Abc_Lit2Var(*(int *)(&pCube->field_0x14 + (long)iVarMax * 4));
        pObj_00 = Saig_ManLi(pAVar1,iVar2);
        local_6c = Abc_LitIsCompl(*(int *)(&pCube->field_0x14 + (long)iVarMax * 4));
        local_6c = 2 - local_6c;
      }
      iVar2 = Pdr_ObjSatVar(p,k,local_6c,pObj_00);
      if (iVar2 < 0) {
        __assert_fail("iVar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                      ,0x9f,"Vec_Int_t *Pdr_ManCubeToLits(Pdr_Man_t *, int, Pdr_Set_t *, int, int)")
        ;
      }
      clk._4_4_ = Abc_MaxInt(clk._4_4_,iVar2);
      p_00 = p->vLits;
      uVar3 = Abc_LitIsCompl(*(int *)(&pCube->field_0x14 + (long)iVarMax * 4));
      iVar2 = Abc_Var2Lit(iVar2,fCompl ^ uVar3);
      Vec_IntPush(p_00,iVar2);
    }
    iVarMax = iVarMax + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Pdr_ManCubeToLits( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, int fCompl, int fNext )
{
    Aig_Obj_t * pObj;
    int i, iVar, iVarMax = 0;
    abctime clk = Abc_Clock();
    Vec_IntClear( p->vLits );
//    assert( !(fNext && fCompl) );
    for ( i = 0; i < pCube->nLits; i++ )
    {
        if ( pCube->Lits[i] == -1 )
            continue;
        if ( fNext )
            pObj = Saig_ManLi( p->pAig, Abc_Lit2Var(pCube->Lits[i]) );
        else
            pObj = Saig_ManLo( p->pAig, Abc_Lit2Var(pCube->Lits[i]) );
        iVar = Pdr_ObjSatVar( p, k, fNext ? 2 - Abc_LitIsCompl(pCube->Lits[i]) : 3, pObj ); assert( iVar >= 0 );
        iVarMax = Abc_MaxInt( iVarMax, iVar );
        Vec_IntPush( p->vLits, Abc_Var2Lit( iVar, fCompl ^ Abc_LitIsCompl(pCube->Lits[i]) ) );
    }
//    sat_solver_setnvars( Pdr_ManSolver(p, k), iVarMax + 1 );
    p->tCnf += Abc_Clock() - clk;
    return p->vLits;
}